

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O2

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,DataType type)

{
  char *pcVar1;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar1 = "int8_t";
    break;
  case 2:
    pcVar1 = "int16_t";
    break;
  case 3:
    pcVar1 = "int32_t";
    break;
  case 4:
    pcVar1 = "int64_t";
    break;
  case 5:
    pcVar1 = "uint8_t";
    break;
  case 6:
    pcVar1 = "uint16_t";
    break;
  case 7:
    pcVar1 = "uint32_t";
    break;
  case 8:
    pcVar1 = "uint64_t";
    break;
  case 9:
    pcVar1 = "float";
    break;
  case 10:
    pcVar1 = "double";
    break;
  case 0xb:
    pcVar1 = "long double";
    break;
  case 0xc:
    pcVar1 = "float complex";
    break;
  case 0xd:
    pcVar1 = "double complex";
    break;
  case 0xe:
    pcVar1 = "string";
    break;
  case 0xf:
    pcVar1 = "char";
    break;
  case 0x10:
    pcVar1 = "struct";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(DataType type)
{
    // Keep in sync with helper::GetDataTypeFromString
    switch (type)
    {
    case DataType::None:
        break;
    case DataType::Char:
        return "char";
    case DataType::Int8:
        return "int8_t";
    case DataType::Int16:
        return "int16_t";
    case DataType::Int32:
        return "int32_t";
    case DataType::Int64:
        return "int64_t";
    case DataType::UInt8:
        return "uint8_t";
    case DataType::UInt16:
        return "uint16_t";
    case DataType::UInt32:
        return "uint32_t";
    case DataType::UInt64:
        return "uint64_t";
    case DataType::Float:
        return "float";
    case DataType::Double:
        return "double";
    case DataType::LongDouble:
        return "long double";
    case DataType::FloatComplex:
        return "float complex";
    case DataType::DoubleComplex:
        return "double complex";
    case DataType::String:
        return "string";
    case DataType::Struct:
        return "struct";
    }
    return std::string();
}